

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void av1_dec_row_mt_dealloc(AV1DecRowMTSync *dec_row_mt_sync)

{
  long *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      for (in_stack_fffffffffffffff4 = 0; in_stack_fffffffffffffff4 < (int)in_RDI[2];
          in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
        pthread_mutex_destroy((pthread_mutex_t *)(*in_RDI + (long)in_stack_fffffffffffffff4 * 0x28))
        ;
      }
      aom_free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    }
    if (in_RDI[1] != 0) {
      for (in_stack_fffffffffffffff4 = 0; in_stack_fffffffffffffff4 < (int)in_RDI[2];
          in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
        pthread_cond_destroy((pthread_cond_t *)(in_RDI[1] + (long)in_stack_fffffffffffffff4 * 0x30))
        ;
      }
      aom_free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    }
    aom_free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    memset(in_RDI,0,0x40);
  }
  return;
}

Assistant:

void av1_dec_row_mt_dealloc(AV1DecRowMTSync *dec_row_mt_sync) {
  if (dec_row_mt_sync != NULL) {
#if CONFIG_MULTITHREAD
    int i;
    if (dec_row_mt_sync->mutex_ != NULL) {
      for (i = 0; i < dec_row_mt_sync->allocated_sb_rows; ++i) {
        pthread_mutex_destroy(&dec_row_mt_sync->mutex_[i]);
      }
      aom_free(dec_row_mt_sync->mutex_);
    }
    if (dec_row_mt_sync->cond_ != NULL) {
      for (i = 0; i < dec_row_mt_sync->allocated_sb_rows; ++i) {
        pthread_cond_destroy(&dec_row_mt_sync->cond_[i]);
      }
      aom_free(dec_row_mt_sync->cond_);
    }
#endif  // CONFIG_MULTITHREAD
    aom_free(dec_row_mt_sync->cur_sb_col);

    // clear the structure as the source of this call may be a resize in which
    // case this call will be followed by an _alloc() which may fail.
    av1_zero(*dec_row_mt_sync);
  }
}